

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

TaskSpec * __thiscall
Database::allocate_task
          (Database *this,string *request,string *conn_id,
          vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
          *locks)

{
  pointer pvVar1;
  TaskSpec *pTVar2;
  source_loc loc;
  bool bVar3;
  logger *this_00;
  long lVar4;
  undefined8 *puVar5;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Array_type *__vtable;
  pointer lock;
  string_view_t fmt;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>,_bool>
  pVar6;
  string_view_t fmt_00;
  uint64_t task_id;
  uint64_t epoch_ms;
  TaskSpec *local_88;
  undefined1 local_80 [32];
  string *local_60;
  string *local_58;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *local_50;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  local_48;
  
  lock = (locks->
         super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (locks->
           super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_60 = conn_id;
  local_58 = request;
  local_50 = locks;
  if (lock != pvVar1) {
    do {
      describe_lock_abi_cxx11_((string *)local_80,lock);
      this_00 = spdlog::default_logger_raw();
      local_48.
      super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      loc.funcname = (char *)0x0;
      loc.filename = (char *)0x0;
      loc.line = 0;
      loc._12_4_ = 0;
      fmt.size_ = 8;
      fmt.data_ = "LOCK: {}";
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
      spdlog::logger::log<std::__cxx11::string>(this_00,loc,info,fmt,(string *)local_80);
      if ((Database *)local_80._0_8_ != (Database *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      lVar4 = (long)(char)(lock->super__Variant_base<DatasetLock,_IteratorLock>).
                          super__Move_assign_alias<DatasetLock,_IteratorLock>.
                          super__Copy_assign_alias<DatasetLock,_IteratorLock>.
                          super__Move_ctor_alias<DatasetLock,_IteratorLock>.
                          super__Copy_ctor_alias<DatasetLock,_IteratorLock>.
                          super__Variant_storage_alias<DatasetLock,_IteratorLock>._M_index;
      local_80._0_8_ = this;
      if (lVar4 == -1) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = &PTR__exception_001eb750;
        puVar5[1] = "std::visit: variant is valueless";
        __cxa_throw(puVar5,&std::bad_variant_access::typeinfo,std::exception::~exception);
      }
      bVar3 = (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Database.cpp:89:25)_&&,_const_std::variant<DatasetLock,_IteratorLock>_&>
                ::_S_vtable._M_arr[lVar4]._M_data)((anon_class_8_1_8991fb9c *)local_80,lock);
      if (!bVar3) {
        describe_lock_abi_cxx11_((string *)local_80,lock);
        fmt_00.size_ = (size_t)local_80;
        fmt_00.data_ = (char *)0xe;
        spdlog::warn<std::__cxx11::string>((spdlog *)"Can\'t lock {}!",fmt_00,args);
        if ((Database *)local_80._0_8_ != (Database *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Can\'t acquire lock");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lock = lock + 1;
    } while (lock != pvVar1);
  }
  local_80._0_8_ = this->last_task_id + 1;
  this->last_task_id = local_80._0_8_;
  local_48.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)get_milli_timestamp();
  std::
  make_unique<TaskSpec,unsigned_long&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long&,std::vector<std::variant<DatasetLock,IteratorLock>,std::allocator<std::variant<DatasetLock,IteratorLock>>>const&>
            ((unsigned_long *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,local_60,
             (unsigned_long *)local_58,&local_48);
  pVar6 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_long&,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->tasks,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     &local_88);
  pTVar2 = *(TaskSpec **)
            ((long)pVar6.first.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
            + 0x10);
  if (local_88 != (TaskSpec *)0x0) {
    std::default_delete<TaskSpec>::operator()((default_delete<TaskSpec> *)&local_88,local_88);
  }
  return pTVar2;
}

Assistant:

TaskSpec *Database::allocate_task(const std::string &request,
                                  const std::string &conn_id,
                                  const std::vector<DatabaseLock> &locks) {
    for (const auto &lock : locks) {
        spdlog::info("LOCK: {}", describe_lock(lock));
        if (!std::visit([this](auto &l) { return can_acquire(l); }, lock)) {
            spdlog::warn("Can't lock {}!", describe_lock(lock));
            throw std::runtime_error("Can't acquire lock");
        }
    }
    uint64_t task_id = allocate_task_id();
    uint64_t epoch_ms = get_milli_timestamp();
    auto new_task{
        std::make_unique<TaskSpec>(task_id, conn_id, request, epoch_ms, locks)};
    return tasks.emplace(task_id, std::move(new_task)).first->second.get();
}